

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O2

Elem * new_string(Grammar *g,char *s,char *e,Rule *r)

{
  char *pcVar1;
  byte bVar2;
  byte bVar3;
  Term *pTVar4;
  ushort *puVar5;
  char cVar6;
  uint uVar7;
  Elem *pEVar8;
  ushort **ppuVar9;
  long lVar10;
  size_t sVar11;
  int __base;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  char *pcVar16;
  
  pEVar8 = new_term_string(g,s + 1,e + -1,r);
  *(uint *)&((pEVar8->e).nterm)->name = (uint)(*s == '\"');
  pTVar4 = (pEVar8->e).term;
  pcVar16 = pTVar4->string;
  pcVar12 = pcVar16;
  do {
    cVar6 = *pcVar16;
    if (cVar6 != '\\') {
      if (cVar6 == '\0') {
        *pcVar12 = '\0';
        pcVar16 = pTVar4->string;
        sVar11 = strlen(pcVar16);
        pTVar4->string_len = (int)sVar11;
        if ((int)sVar11 != 0) {
          return pEVar8;
        }
        d_fail("empty string after unescape \'%s\'",pcVar16);
        return pEVar8;
      }
      *pcVar12 = cVar6;
      goto LAB_00139c68;
    }
    pcVar15 = pcVar16 + 1;
    bVar2 = pcVar16[1];
    cVar6 = '\\';
    switch(bVar2) {
    case 0x61:
      *pcVar12 = '\a';
      pcVar16 = pcVar15;
      break;
    case 0x62:
      *pcVar12 = '\b';
      pcVar16 = pcVar15;
      break;
    case 99:
      *pcVar12 = '\0';
      return pEVar8;
    case 100:
      ppuVar9 = __ctype_b_loc();
      puVar5 = *ppuVar9;
      bVar2 = pcVar16[2];
      if ((*(byte *)((long)puVar5 + (ulong)bVar2 * 2 + 1) & 8) != 0) {
        bVar3 = pcVar16[3];
        if ((*(byte *)((long)puVar5 + (ulong)bVar3 * 2 + 1) & 8) == 0) {
          uVar7 = 1;
        }
        else if (((*(byte *)((long)puVar5 + (ulong)(byte)pcVar16[4] * 2 + 1) & 8) == 0) ||
                (('1' < (char)bVar2 &&
                 ((bVar2 != 0x32 || (('4' < (char)bVar3 && ('5' < pcVar16[4] || bVar3 != 0x35)))))))
                ) {
          uVar7 = 2;
        }
        else {
          uVar7 = 3;
        }
        __base = 10;
LAB_00139ca2:
        pcVar15 = pcVar16 + 2;
        uVar13 = (ulong)(uVar7 + 1);
        uVar14 = (ulong)uVar7;
LAB_00139b3f:
        pcVar1 = pcVar16 + uVar13;
        cVar6 = pcVar15[uVar14];
        pcVar15[uVar14] = '\0';
        lVar10 = strtol(pcVar15,(char **)0x0,__base);
        *pcVar12 = (char)lVar10;
        pcVar15[uVar14] = cVar6;
        pcVar15 = pcVar16 + uVar13;
        pcVar16 = pcVar1;
        if (*pcVar15 < '\x01') {
          d_fail("encountered an escaped NULL while processing \'%s\'",pTVar4->string);
          cVar6 = *pcVar1;
switchD_00139b2c_caseD_65:
          *pcVar12 = cVar6;
          pcVar12[1] = pcVar16[1];
          pcVar12 = pcVar12 + 1;
          pcVar16 = pcVar16 + 1;
        }
        break;
      }
      goto LAB_00139c6b;
    case 0x65:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x75:
    case 0x77:
      goto switchD_00139b2c_caseD_65;
    case 0x66:
      *pcVar12 = '\f';
      pcVar16 = pcVar15;
      break;
    case 0x6e:
      *pcVar12 = '\n';
      pcVar16 = pcVar15;
      break;
    case 0x72:
      *pcVar12 = '\r';
      pcVar16 = pcVar15;
      break;
    case 0x74:
      *pcVar12 = '\t';
      pcVar16 = pcVar15;
      break;
    case 0x76:
      *pcVar12 = '\v';
      pcVar16 = pcVar15;
      break;
    case 0x78:
      ppuVar9 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar9 + (ulong)(byte)pcVar16[2] * 2 + 1) & 0x10) != 0) {
        uVar7 = 2 - ((*(byte *)((long)*ppuVar9 + (ulong)(byte)pcVar16[3] * 2 + 1) & 0x10) == 0);
        __base = 0x10;
        goto LAB_00139ca2;
      }
      goto LAB_00139c6b;
    default:
      if (bVar2 - 0x30 < 8) {
        ppuVar9 = __ctype_b_loc();
        if (((pcVar16[2] & 0xfeU) == 0x38) || (((*ppuVar9)[(byte)pcVar16[2]] & 0x800) == 0)) {
          uVar13 = 1;
        }
        else {
          uVar13 = (ulong)((pcVar16[3] & 0xfeU) == 0x38 ||
                          (*(byte *)((long)*ppuVar9 + (ulong)(byte)pcVar16[3] * 2 + 1) & 8) == 0) ^
                   3;
        }
        __base = 8;
        uVar14 = uVar13;
        goto LAB_00139b3f;
      }
      if (bVar2 == 0x22) {
        if (pTVar4->kind != TERM_REGEX) goto switchD_00139b2c_caseD_65;
        *pcVar12 = '\"';
        pcVar16 = pcVar15;
      }
      else if (bVar2 == 0x27) {
        if (pTVar4->kind != TERM_STRING) goto switchD_00139b2c_caseD_65;
        *pcVar12 = '\'';
        pcVar16 = pcVar15;
      }
      else {
        if ((bVar2 != 0x5c) || (pTVar4->kind != TERM_STRING)) goto switchD_00139b2c_caseD_65;
        *pcVar12 = '\\';
        pcVar16 = pcVar15;
      }
    }
LAB_00139c68:
    pcVar12 = pcVar12 + 1;
    pcVar15 = pcVar16;
LAB_00139c6b:
    pcVar16 = pcVar15 + 1;
  } while( true );
}

Assistant:

Elem *new_string(Grammar *g, char *s, char *e, Rule *r) {
  Elem *x = new_term_string(g, s + 1, e - 1, r);
  x->e.term->kind = (*s == '"') ? TERM_REGEX : TERM_STRING;
  unescape_term_string(x->e.term);
  return x;
}